

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

LogicalType * __thiscall duckdb::ColumnData::RootType(ColumnData *this)

{
  optional_ptr<duckdb::ColumnData,_true> *this_00;
  
  if ((this->parent).ptr != (ColumnData *)0x0) {
    this_00 = &this->parent;
    do {
      optional_ptr<duckdb::ColumnData,_true>::CheckValid(this_00);
      this = this_00->ptr;
      this_00 = &this->parent;
    } while ((this->parent).ptr != (ColumnData *)0x0);
  }
  return &this->type;
}

Assistant:

const LogicalType &ColumnData::RootType() const {
	if (parent) {
		return parent->RootType();
	}
	return type;
}